

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QWidgetItemData>::moveAppend
          (QGenericArrayOps<QWidgetItemData> *this,QWidgetItemData *b,QWidgetItemData *e)

{
  QWidgetItemData *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QWidgetItemData *in_RDI;
  QWidgetItemData *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QWidgetItemData>::begin
                        ((QArrayDataPointer<QWidgetItemData> *)0x8ad507);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QWidgetItemData::QWidgetItemData(this_00,in_RDI);
      local_10 = local_10 + 0x28;
      *(long *)((long)&(in_RDI->value).d.data + 8) =
           *(long *)((long)&(in_RDI->value).d.data + 8) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }